

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QASMFile.hpp
# Opt level: O2

int __thiscall
qclab::io::QASMFile::
parse1const<qclab::qgates::PauliZ<std::complex<double>>,qclab::QObject<std::complex<double>>>
          (QASMFile *this,string *name,string *command,
          unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>
          *gate)

{
  QObject<std::complex<double>_> *pQVar1;
  _Alloc_hider _Var2;
  __type _Var3;
  string *str;
  int iVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  int qubit;
  
  iVar4 = 0;
  std::__cxx11::string::substr((ulong)&local_70,(ulong)command);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&qubit,name,
                 &this->qregName_);
  _Var3 = std::operator==(&local_70,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &qubit);
  std::__cxx11::string::~string((string *)&qubit);
  std::__cxx11::string::~string((string *)&local_70);
  if (_Var3) {
    str = (string *)std::__cxx11::string::erase((ulong)command,0);
    qubit = parseQubit(this,str);
    std::make_unique<qclab::qgates::PauliZ<std::complex<double>>,int_const&>((int *)&local_70);
    _Var2._M_p = local_70._M_dataplus._M_p;
    local_70._M_dataplus._M_p = (pointer)0x0;
    pQVar1 = (gate->_M_t).
             super___uniq_ptr_impl<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_qclab::QObject<std::complex<double>_>_*,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>
             .super__Head_base<0UL,_qclab::QObject<std::complex<double>_>_*,_false>._M_head_impl;
    (gate->_M_t).
    super___uniq_ptr_impl<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_qclab::QObject<std::complex<double>_>_*,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>
    .super__Head_base<0UL,_qclab::QObject<std::complex<double>_>_*,_false>._M_head_impl =
         (QObject<std::complex<double>_> *)_Var2._M_p;
    if (pQVar1 != (QObject<std::complex<double>_> *)0x0) {
      (*pQVar1->_vptr_QObject[0xd])();
      if ((long *)local_70._M_dataplus._M_p != (long *)0x0) {
        (**(code **)(*(long *)local_70._M_dataplus._M_p + 0x68))();
      }
    }
    iVar4 = 1;
  }
  return iVar4;
}

Assistant:

int parse1const( std::string name , std::string& command ,
                       std::unique_ptr< GATE >& gate ) const {
        const auto n1 = name.length() ;
        const auto n2 = qregName_.length() ;
        if ( command.substr( 0 , n1 + n2 ) == name + qregName_ ) {
          const auto qubit = parseQubit( command.erase( 0 , n1 + n2 + 1 ) ) ;
          gate = std::make_unique< G >( qubit ) ;
          return 1 ;
        }
        return 0 ;
      }